

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m512 _v;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00004a18;
  Mat *in_stack_00004a20;
  Mat *in_stack_00004a28;
  Mat *in_stack_00004a30;
  Mat *in_stack_00004a38;
  int in_stack_fffffffffffffb1c;
  size_t in_stack_fffffffffffffb20;
  void **ppvVar1;
  undefined8 in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  Mat *in_stack_fffffffffffffb38;
  Allocator *in_stack_fffffffffffffb98;
  int local_420;
  int local_41c;
  undefined8 *local_418;
  int local_410;
  int local_40c;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  long *local_3e8;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined8 local_3c8;
  undefined8 *local_3c0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  long local_388;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined8 local_368;
  int local_360;
  int local_35c;
  void *local_358;
  int *local_350;
  long local_348;
  undefined4 local_340;
  long *local_338;
  undefined4 local_330;
  int local_32c;
  int local_328;
  undefined4 local_324;
  undefined4 local_320;
  long local_318;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c0;
  void **local_2b0;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  undefined8 *local_268;
  undefined8 *local_248;
  undefined1 local_23d;
  int local_23c;
  void **local_238;
  undefined8 *local_230;
  undefined8 *local_210;
  int local_204;
  undefined8 *local_200;
  undefined1 local_1f5;
  int local_1f4;
  undefined8 *local_1e8;
  void *local_198;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 *local_118;
  undefined8 local_110;
  undefined4 local_104;
  undefined8 local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  void **local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  long local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  long *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_2fc = *(int *)((long)in_RDI + 0x2c);
  local_300 = (int)in_RDI[7];
  local_304 = *(int *)(in_RSI + 0x2c);
  local_308 = *(int *)(in_RSI + 0x30);
  local_30c = local_304 * local_308;
  local_310 = in_R8D * in_R9D;
  local_110 = *(undefined8 *)(CONCAT44(in_stack_0000002c,stride_h) + 0x10);
  local_e8 = &local_358;
  local_100 = 0x40;
  local_104 = 0x10;
  local_358 = (void *)0x0;
  local_350 = (int *)0x0;
  local_348 = 0;
  local_340 = 0;
  local_338 = (long *)0x0;
  local_330 = 0;
  local_32c = 0;
  local_328 = 0;
  local_324 = 0;
  local_320 = 0;
  local_318 = 0;
  local_2f8 = in_R9D;
  local_2f4 = in_R8D;
  local_2d8 = in_RDI;
  local_f4 = local_300;
  local_f0 = local_310;
  local_ec = local_30c;
  Mat::create(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20),
              (int)in_stack_fffffffffffffb30,(int)((ulong)in_stack_fffffffffffffb28 >> 0x20),
              in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,in_stack_fffffffffffffb98);
  local_35c = (local_2fc * stride_w - local_304 * dilation_h) * 0x10;
  for (local_360 = 0; local_360 < local_300; local_360 = local_360 + 1) {
    local_1e8 = &local_3a8;
    local_b4 = *(int *)((long)local_2d8 + 0x2c);
    local_b8 = (int)local_2d8[6];
    local_bc = *(undefined4 *)((long)local_2d8 + 0x34);
    local_c8 = *local_2d8 + local_2d8[8] * (long)local_360 * local_2d8[2];
    local_d0 = local_2d8[2];
    local_d4 = (undefined4)local_2d8[3];
    local_e0 = local_2d8[4];
    local_b0 = &local_3a8;
    local_58 = (long)local_b4 * (long)local_b8 * local_d0;
    local_230 = &local_408;
    local_238 = &local_358;
    local_90 = (undefined8 *)((long)local_358 + local_318 * local_360 * local_348);
    local_78 = &local_408;
    local_68 = (long)local_32c * (long)local_328 * local_348;
    local_210 = &local_408;
    local_2d0 = &local_408;
    local_3e8 = local_338;
    local_408 = 0;
    local_3f8 = 0;
    local_3f0 = 0;
    local_3e0 = 0;
    local_3dc = 0;
    local_3d8 = 0;
    local_3d4 = 0;
    local_3d0 = 0;
    local_3c8 = 0;
    local_400 = 0;
    local_3c0 = local_90;
    for (local_40c = 0; local_40c < local_2f8; local_40c = local_40c + 1) {
      for (local_410 = 0; local_410 < local_2f4; local_410 = local_410 + 1) {
        local_204 = dilation_w * local_40c;
        local_200 = &local_3a8;
        local_418 = (undefined8 *)
                    (local_c8 + (long)local_b4 * (long)local_204 * local_d0 +
                    (long)(in_stack_00000008 * local_410 * 0x10) * 4);
        for (local_41c = 0; local_41c < local_308; local_41c = local_41c + 1) {
          for (local_420 = 0; local_420 < local_304; local_420 = local_420 + 1) {
            local_188 = local_418;
            local_180 = *local_418;
            uStack_178 = local_418[1];
            uStack_170 = local_418[2];
            uStack_168 = local_418[3];
            uStack_160 = local_418[4];
            uStack_158 = local_418[5];
            uStack_150 = local_418[6];
            uStack_148 = local_418[7];
            local_118 = local_3c0;
            *local_3c0 = local_180;
            local_3c0[1] = uStack_178;
            local_3c0[2] = uStack_170;
            local_3c0[3] = uStack_168;
            local_3c0[4] = uStack_160;
            local_3c0[5] = uStack_158;
            local_3c0[6] = uStack_150;
            local_3c0[7] = uStack_148;
            local_418 = (undefined8 *)((long)local_418 + (long)(dilation_h << 4) * 4);
            local_3c0 = local_3c0 + 8;
          }
          local_418 = (undefined8 *)((long)local_418 + (long)local_35c * 4);
        }
      }
    }
    local_2c0 = &local_3a8;
    local_5c = 0x10;
    local_6c = 0x10;
    local_7c = local_32c;
    local_80 = local_328;
    local_84 = local_324;
    local_98 = local_348;
    local_9c = local_340;
    local_a8 = local_338;
    local_1f4 = local_360;
    local_1f5 = 1;
    local_23c = local_360;
    local_23d = 1;
    local_3a8 = 0;
    local_398 = 0;
    local_390 = 0;
    local_380 = 0;
    local_37c = 0;
    local_378 = 0;
    local_374 = 0;
    local_370 = 0;
    local_368 = 0;
    local_3a0 = 0;
    local_268 = local_2c0;
    local_248 = local_2d0;
    local_388 = local_e0;
  }
  im2col_sgemm_pack16_avx512
            (in_stack_00004a38,in_stack_00004a30,in_stack_00004a28,in_stack_00004a20,
             in_stack_00004a18);
  ppvVar1 = &local_358;
  if (local_350 != (int *)0x0) {
    local_28c = 0xffffffff;
    LOCK();
    local_290 = *local_350;
    *local_350 = *local_350 + -1;
    UNLOCK();
    if (local_290 == 1) {
      local_2b0 = ppvVar1;
      local_288 = ppvVar1;
      if (local_338 == (long *)0x0) {
        local_198 = local_358;
        if (local_358 != (void *)0x0) {
          free(local_358);
        }
      }
      else {
        (**(code **)(*local_338 + 0x18))(local_338,local_358);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 64u, 16, opt.workspace_allocator);
    {
        const int gap = (w * stride_h - outw * stride_w) * 16;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            float* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const float* sptr = img.row(dilation_h * u) + dilation_w * v * 16;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            __m512 _v = _mm512_load_ps(sptr);
                            _mm512_store_ps(ptr, _v);

                            sptr += stride_w * 16;
                            ptr += 16;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack16_avx512(bottom_im2col, top_blob, kernel, _bias, opt);
}